

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseTools.cpp
# Opt level: O3

void tonk::SetTonkAddressStr(TonkAddress *addrOut,UDPAddress *addrIn)

{
  uint16_t uVar1;
  uint uVar2;
  size_t i;
  ulong uVar3;
  ulong uVar4;
  address ip_addr;
  string addrstr;
  address local_58;
  string local_38;
  
  uVar1 = swap_bytes((addrIn->impl_).data_.v4.sin_port);
  addrOut->UDPPort = uVar1;
  if ((addrIn->impl_).data_.base.sa_family == 2) {
    uVar2 = (addrIn->impl_).data_.v6.sin6_flowinfo;
    local_58.ipv6_address_.scope_id_ = 0;
    local_58.ipv6_address_.addr_.__in6_u = (anon_union_16_3_a3f0114d_for___in6_u)0x0;
    local_58._0_8_ = (ulong)uVar2 << 0x20;
    if (uVar2 == 0) {
LAB_00151bb6:
      addrOut->NetworkString[0x20] = '\0';
      addrOut->NetworkString[0x21] = '\0';
      addrOut->NetworkString[0x22] = '\0';
      addrOut->NetworkString[0x23] = '\0';
      addrOut->NetworkString[0x24] = '\0';
      addrOut->NetworkString[0x25] = '\0';
      addrOut->NetworkString[0x26] = '\0';
      addrOut->NetworkString[0x27] = '\0';
      addrOut->NetworkString[0] = '\0';
      addrOut->NetworkString[1] = '\0';
      addrOut->NetworkString[2] = '\0';
      addrOut->NetworkString[3] = '\0';
      addrOut->NetworkString[4] = '\0';
      addrOut->NetworkString[5] = '\0';
      addrOut->NetworkString[6] = '\0';
      addrOut->NetworkString[7] = '\0';
      addrOut->NetworkString[8] = '\0';
      addrOut->NetworkString[9] = '\0';
      addrOut->NetworkString[10] = '\0';
      addrOut->NetworkString[0xb] = '\0';
      addrOut->NetworkString[0xc] = '\0';
      addrOut->NetworkString[0xd] = '\0';
      addrOut->NetworkString[0xe] = '\0';
      addrOut->NetworkString[0xf] = '\0';
      addrOut->NetworkString[0x10] = '\0';
      addrOut->NetworkString[0x11] = '\0';
      addrOut->NetworkString[0x12] = '\0';
      addrOut->NetworkString[0x13] = '\0';
      addrOut->NetworkString[0x14] = '\0';
      addrOut->NetworkString[0x15] = '\0';
      addrOut->NetworkString[0x16] = '\0';
      addrOut->NetworkString[0x17] = '\0';
      addrOut->NetworkString[0x18] = '\0';
      addrOut->NetworkString[0x19] = '\0';
      addrOut->NetworkString[0x1a] = '\0';
      addrOut->NetworkString[0x1b] = '\0';
      addrOut->NetworkString[0x1c] = '\0';
      addrOut->NetworkString[0x1d] = '\0';
      addrOut->NetworkString[0x1e] = '\0';
      addrOut->NetworkString[0x1f] = '\0';
      return;
    }
  }
  else {
    local_58.ipv6_address_.addr_.__in6_u = (addrIn->impl_).data_.v6.sin6_addr.__in6_u;
    local_58.ipv6_address_.scope_id_ = (unsigned_long)(addrIn->impl_).data_.v6.sin6_scope_id;
    local_58.type_ = ipv6;
    local_58.ipv4_address_.addr_.s_addr = (in4_addr_type)0x0;
    if (local_58.ipv6_address_.addr_.__in6_u == (anon_union_16_3_a3f0114d_for___in6_u)0x0)
    goto LAB_00151bb6;
  }
  asio::ip::address::to_string_abi_cxx11_(&local_38,&local_58);
  uVar3 = 0x27;
  if (local_38._M_string_length < 0x27) {
    uVar3 = local_38._M_string_length;
  }
  if (local_38._M_string_length != 0) {
    uVar4 = 0;
    do {
      addrOut->NetworkString[uVar4] = local_38._M_dataplus._M_p[uVar4];
      uVar4 = uVar4 + 1;
    } while (uVar3 != uVar4);
  }
  memset(addrOut->NetworkString + uVar3,0,0x28 - uVar3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return;
}

Assistant:

void SetTonkAddressStr(TonkAddress& addrOut, const UDPAddress& addrIn)
{
    addrOut.UDPPort = addrIn.port();

    const auto ip_addr = addrIn.address();
    if (ip_addr.is_unspecified())
    {
        memset(addrOut.NetworkString, 0, sizeof(addrOut.NetworkString));
        return;
    }

    const std::string addrstr = ip_addr.to_string();

    size_t slen = addrstr.size();
    if (slen > TONK_IP_STRING_MAX_CHARS)
        slen = TONK_IP_STRING_MAX_CHARS;
    static_assert(sizeof(addrOut.NetworkString) == TONK_IP_STRING_BYTES, "Update this");

    for (size_t i = 0; i < slen; ++i)
        addrOut.NetworkString[i] = addrstr[i];
    for (size_t i = slen; i < TONK_IP_STRING_BYTES; ++i)
        addrOut.NetworkString[i] = '\0';
}